

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O2

void __thiscall booster::aio::epoll_reactor::epoll_reactor(epoll_reactor *this)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  
  (this->super_base_fast_reactor).events_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_base_fast_reactor).events_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_base_fast_reactor).events_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_base_poll_reactor).super_reactor_impl._vptr_reactor_impl =
       (_func_int **)&PTR_select_001d8ef0;
  iVar1 = epoll_create(0x10);
  this->pollfd_ = iVar1;
  if (iVar1 != 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  piVar2 = __errno_location();
  system::system_error::system_error(this_00,*piVar2,syscat,"Failed to create epoll descriptor");
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

epoll_reactor() 
		{
			pollfd_=::epoll_create(16);
			if(!pollfd_)
				throw system::system_error(errno,syscat,"Failed to create epoll descriptor");
		}